

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O2

void test_iter(void)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  int __fd;
  undefined8 uVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  void *__buf;
  void *__buf_00;
  void *__s1;
  void *__s2;
  uint uVar8;
  char *pcVar9;
  ulong uVar10;
  bson_iter_t iter;
  undefined1 local_180 [336];
  
  uVar4 = bson_bcon_magic();
  lVar5 = bcon_new(0,"foo",uVar4,0xf,10,0);
  uVar6 = bson_bcone_magic();
  cVar2 = bcon_extract(lVar5,"foo",uVar6,0x1d,local_180,0);
  if (cVar2 == '\0') {
    pcVar9 = "BCON_EXTRACT (bcon, \"foo\", BCONE_ITER (iter))";
    uVar4 = 0x1dc;
  }
  else {
    iVar3 = bson_iter_type(local_180);
    if (iVar3 == 0x10) {
      iVar3 = bson_iter_int32(local_180);
      if (iVar3 == 10) {
        lVar7 = bcon_new(0,"foo",uVar4,0x1d,local_180,0);
        __buf = (void *)bson_get_data(lVar7);
        __buf_00 = (void *)bson_get_data(lVar5);
        if (*(int *)(lVar5 + 4) == *(int *)(lVar7 + 4)) {
          __s1 = (void *)bson_get_data(lVar5);
          __s2 = (void *)bson_get_data(lVar7);
          iVar3 = bcmp(__s1,__s2,(ulong)*(uint *)(lVar5 + 4));
          if (iVar3 == 0) {
            bson_destroy(lVar5);
            bson_destroy(lVar7);
            return;
          }
        }
        uVar4 = bson_as_canonical_extended_json(lVar7,0);
        uVar6 = bson_as_canonical_extended_json(lVar5,0);
        uVar8 = *(uint *)(lVar7 + 4);
        uVar1 = *(uint *)(lVar5 + 4);
        for (uVar10 = 0; (uVar8 != (uint)uVar10 && ((uint)uVar10 < uVar1)); uVar10 = uVar10 + 1) {
          if (*(char *)((long)__buf + uVar10) != *(char *)((long)__buf_00 + uVar10)) {
            uVar10 = uVar10 & 0xffffffff;
            goto LAB_00135dff;
          }
        }
        if (uVar8 < uVar1) {
          uVar8 = uVar1;
        }
        uVar10 = (ulong)(uVar8 - 1);
LAB_00135dff:
        fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar10,uVar4,uVar6);
        iVar3 = open("failure.bad.bson",0x42,0x1a0);
        __fd = open("failure.expected.bson",0x42,0x1a0);
        if (iVar3 == -1) {
          pcVar9 = "fd1 != -1";
        }
        else if (__fd == -1) {
          pcVar9 = "fd2 != -1";
        }
        else {
          uVar8 = *(uint *)(lVar7 + 4);
          uVar10 = write(iVar3,__buf,(ulong)uVar8);
          if (uVar10 == uVar8) {
            uVar8 = *(uint *)(lVar5 + 4);
            uVar10 = write(__fd,__buf_00,(ulong)uVar8);
            if (uVar10 == uVar8) {
              close(iVar3);
              close(__fd);
              pcVar9 = "0";
            }
            else {
              pcVar9 = "(bcon)->len == bson_write (fd2, expected_data, (bcon)->len)";
            }
          }
          else {
            pcVar9 = "(other)->len == bson_write (fd1, bson_data, (other)->len)";
          }
        }
        uVar4 = 0x1e3;
      }
      else {
        pcVar9 = "bson_iter_int32 (&iter) == 10";
        uVar4 = 0x1df;
      }
    }
    else {
      pcVar9 = "bson_iter_type (&iter) == BSON_TYPE_INT32";
      uVar4 = 0x1de;
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
          ,uVar4,"test_iter",pcVar9);
  abort();
}

Assistant:

static void
test_iter (void)
{
   bson_t bcon, expected;
   bson_iter_t iter;

   bson_init (&bcon);
   bson_init (&expected);

   bson_append_int32 (&expected, "foo", -1, 100);
   bson_iter_init_find (&iter, &expected, "foo");

   BCON_APPEND (&bcon, "foo", BCON_ITER (&iter));

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
}